

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O0

char * Qiniu_MD5_HexStr_From_Reader(Qiniu_Reader r)

{
  uchar *digest_output;
  Qiniu_Digest *self;
  void *data;
  size_t sVar1;
  int local_64;
  int i;
  size_t n;
  char *buff;
  size_t buffLen;
  size_t unused;
  Qiniu_Digest *md5_digest;
  char *pcStack_30;
  char temp [3];
  char *signHex;
  int signLen;
  uchar *sign;
  Qiniu_Reader r_local;
  
  digest_output = (uchar *)calloc(1,0x10);
  pcStack_30 = (char *)malloc(0x21);
  self = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);
  data = malloc(0x400000);
  do {
    sVar1 = (*r.Read)(data,1,0x400000,r.self);
    Qiniu_Digest_Update(self,data,(int)sVar1);
  } while (sVar1 == 0x400000);
  free(data);
  Qiniu_Digest_Final(self,digest_output,(size_t *)0x0);
  for (local_64 = 0; local_64 < 0x10; local_64 = local_64 + 1) {
    snprintf((char *)((long)&md5_digest + 5),3,"%02x",(ulong)digest_output[local_64]);
    md5_digest._7_1_ = 0;
    *(undefined2 *)(pcStack_30 + (local_64 << 1)) = md5_digest._5_2_;
  }
  pcStack_30[0x20] = '\0';
  Qiniu_Free(digest_output);
  return pcStack_30;
}

Assistant:

const char *Qiniu_MD5_HexStr_From_Reader(Qiniu_Reader r)
	{

		unsigned char *sign = (unsigned char *)calloc(sizeof(unsigned char), MD5_DIGEST_LENGTH);
		int signLen = MD5_DIGEST_LENGTH * 2 + 1;
		char *signHex = (char *)malloc(sizeof(char) * signLen);
		char temp[3];
		Qiniu_Digest *md5_digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);

		{
			size_t unused = 1;
			size_t buffLen = (4 << 20); //read 4M each time
			char *buff = (char *)malloc(sizeof(char) * buffLen);
			size_t n = 0;
			do
			{
				n = r.Read(buff, unused, buffLen, r.self);
				Qiniu_Digest_Update(md5_digest, buff, (int)n);
			} while (n == buffLen);
			free(buff);
		}
		Qiniu_Digest_Final(md5_digest, sign, NULL);
		for (int i = 0; i < MD5_DIGEST_LENGTH; i++)
		{
			Qiniu_snprintf(temp, 3, "%02x", sign[i]);
			temp[2] = '\0';
			memcpy(&(signHex[i * 2]), temp, 2);
		}
		signHex[signLen - 1] = '\0';
		Qiniu_Free(sign);
		return signHex;
	}